

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcNamedUnit::~IfcNamedUnit(IfcNamedUnit *this)

{
  void *pvVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>)._vptr_ObjectHelper
           [-3];
  pvVar1 = &this->field_0x28 + (long)p_Var2;
  *(undefined ***)((long)pvVar1 + -0x28) = &PTR__IfcNamedUnit_008bfb38;
  *(undefined ***)((long)pvVar1 + 0x10) = &PTR__IfcNamedUnit_008bfb60;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcNamedUnit() : Object("IfcNamedUnit") {}